

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Range.cpp
# Opt level: O0

void __thiscall Range::each(Range *this,function<void_(const_CylHead_&)> *func,bool cyls_first)

{
  function<void_(const_CylHead_&)> *pfVar1;
  int iVar2;
  CylHead local_3c;
  int local_34;
  int local_30;
  int head_1;
  int cyl_1;
  int local_24;
  int local_20;
  int cyl;
  int head;
  bool cyls_first_local;
  function<void_(const_CylHead_&)> *func_local;
  Range *this_local;
  
  cyl._3_1_ = cyls_first;
  _head = func;
  func_local = (function<void_(const_CylHead_&)> *)this;
  if ((cyls_first) && (iVar2 = heads(this), 1 < iVar2)) {
    for (local_20 = this->head_begin; local_20 < this->head_end; local_20 = local_20 + 1) {
      for (local_24 = this->cyl_begin; pfVar1 = _head, local_24 < this->cyl_end;
          local_24 = local_24 + 1) {
        CylHead::CylHead((CylHead *)&head_1,local_24,local_20);
        std::function<void_(const_CylHead_&)>::operator()(pfVar1,(CylHead *)&head_1);
      }
    }
  }
  else {
    for (local_30 = this->cyl_begin; local_30 < this->cyl_end; local_30 = local_30 + 1) {
      for (local_34 = this->head_begin; pfVar1 = _head, local_34 < this->head_end;
          local_34 = local_34 + 1) {
        CylHead::CylHead(&local_3c,local_30,local_34);
        std::function<void_(const_CylHead_&)>::operator()(pfVar1,&local_3c);
      }
    }
  }
  return;
}

Assistant:

void Range::each(const std::function<void(const CylHead & cylhead)>& func, bool cyls_first/*=false*/) const
{
    if (cyls_first && heads() > 1)
    {
        for (auto head = head_begin; head < head_end; ++head)
            for (auto cyl = cyl_begin; cyl < cyl_end; ++cyl)
                func(CylHead(cyl, head));
    }
    else
    {
        for (auto cyl = cyl_begin; cyl < cyl_end; ++cyl)
            for (auto head = head_begin; head < head_end; ++head)
                func(CylHead(cyl, head));
    }
}